

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O3

void aom_paeth_predictor_16x32_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [16];
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  ushort uVar16;
  undefined1 auVar17 [15];
  unkuint9 Var18;
  undefined1 auVar19 [11];
  undefined1 auVar20 [13];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  int iVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  short sVar26;
  short sVar29;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar37 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  short sVar48;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  short sVar66;
  short sVar74;
  short sVar75;
  short sVar76;
  short sVar77;
  short sVar78;
  short sVar79;
  short sVar80;
  short sVar81;
  short sVar84;
  short sVar85;
  short sVar86;
  short sVar87;
  short sVar88;
  short sVar89;
  short sVar90;
  
  auVar1 = *(undefined1 (*) [16])left;
  auVar46 = *(undefined1 (*) [16])above;
  auVar10[0xd] = 0;
  auVar10._0_13_ = auVar46._0_13_;
  auVar10[0xe] = auVar46[7];
  auVar11[0xc] = auVar46[6];
  auVar11._0_12_ = auVar46._0_12_;
  auVar11._13_2_ = auVar10._13_2_;
  auVar12[0xb] = 0;
  auVar12._0_11_ = auVar46._0_11_;
  auVar12._12_3_ = auVar11._12_3_;
  auVar13[10] = auVar46[5];
  auVar13._0_10_ = auVar46._0_10_;
  auVar13._11_4_ = auVar12._11_4_;
  auVar14[9] = 0;
  auVar14._0_9_ = auVar46._0_9_;
  auVar14._10_5_ = auVar13._10_5_;
  auVar15[8] = auVar46[4];
  auVar15._0_8_ = auVar46._0_8_;
  auVar15._9_6_ = auVar14._9_6_;
  auVar17._7_8_ = 0;
  auVar17._0_7_ = auVar15._8_7_;
  Var18 = CONCAT81(SUB158(auVar17 << 0x40,7),auVar46[3]);
  auVar21._9_6_ = 0;
  auVar21._0_9_ = Var18;
  auVar19._1_10_ = SUB1510(auVar21 << 0x30,5);
  auVar19[0] = auVar46[2];
  auVar22._11_4_ = 0;
  auVar22._0_11_ = auVar19;
  auVar20._1_12_ = SUB1512(auVar22 << 0x20,3);
  auVar20[0] = auVar46[1];
  auVar25._0_2_ = CONCAT11(0,auVar46[0]);
  auVar25._2_13_ = auVar20;
  auVar25[0xf] = 0;
  auVar24._0_2_ = CONCAT11(0,auVar46[8]);
  auVar24[2] = auVar46[9];
  auVar24[3] = 0;
  auVar24[4] = auVar46[10];
  auVar24[5] = 0;
  auVar24[6] = auVar46[0xb];
  auVar24[7] = 0;
  auVar24[8] = auVar46[0xc];
  auVar24[9] = 0;
  auVar24[10] = auVar46[0xd];
  auVar24[0xb] = 0;
  auVar24[0xc] = auVar46[0xe];
  auVar24[0xd] = 0;
  auVar24[0xe] = auVar46[0xf];
  auVar24[0xf] = 0;
  auVar27 = pshuflw(ZEXT116(above[-1]),ZEXT116(above[-1]),0);
  auVar28._0_4_ = auVar27._0_4_;
  auVar28._4_4_ = auVar28._0_4_;
  auVar28._8_4_ = auVar28._0_4_;
  auVar28._12_4_ = auVar28._0_4_;
  sVar26 = auVar27._0_2_;
  auVar30._0_2_ = auVar25._0_2_ - sVar26;
  sVar29 = auVar27._2_2_;
  sVar31 = auVar20._0_2_;
  auVar30._2_2_ = sVar31 - sVar29;
  sVar32 = auVar19._0_2_;
  auVar30._4_2_ = sVar32 - sVar26;
  sVar33 = (short)Var18;
  auVar30._6_2_ = sVar33 - sVar29;
  sVar34 = auVar15._8_2_;
  auVar30._8_2_ = sVar34 - sVar26;
  sVar35 = auVar13._10_2_;
  auVar30._10_2_ = sVar35 - sVar29;
  sVar36 = auVar11._12_2_;
  uVar16 = auVar10._13_2_ >> 8;
  auVar30._12_2_ = sVar36 - sVar26;
  auVar30._14_2_ = uVar16 - sVar29;
  auVar27 = pabsw(in_XMM4,auVar30);
  auVar37._0_2_ = auVar24._0_2_ - sVar26;
  uVar38 = (ushort)auVar46[9];
  auVar37._2_2_ = uVar38 - sVar29;
  uVar39 = (ushort)auVar46[10];
  auVar37._4_2_ = uVar39 - sVar26;
  uVar40 = (ushort)auVar46[0xb];
  auVar37._6_2_ = uVar40 - sVar29;
  uVar41 = (ushort)auVar46[0xc];
  auVar37._8_2_ = uVar41 - sVar26;
  uVar42 = (ushort)auVar46[0xd];
  auVar37._10_2_ = uVar42 - sVar29;
  uVar43 = (ushort)auVar46[0xe];
  uVar44 = (ushort)auVar46[0xf];
  auVar37._12_2_ = uVar43 - sVar26;
  auVar37._14_2_ = uVar44 - sVar29;
  auVar45 = pabsw(in_XMM7,auVar37);
  iVar23 = 0x10;
  auVar46 = _DAT_004d8ba0;
  do {
    auVar47 = pshufb(auVar1,auVar46);
    sVar48 = auVar30._0_2_ + auVar47._0_2_;
    sVar52 = auVar30._2_2_ + auVar47._2_2_;
    sVar53 = auVar30._4_2_ + auVar47._4_2_;
    sVar54 = auVar30._6_2_ + auVar47._6_2_;
    sVar55 = auVar30._8_2_ + auVar47._8_2_;
    sVar56 = auVar30._10_2_ + auVar47._10_2_;
    sVar57 = auVar30._12_2_ + auVar47._12_2_;
    sVar58 = auVar30._14_2_ + auVar47._14_2_;
    auVar69._0_2_ = sVar48 - auVar25._0_2_;
    auVar69._2_2_ = sVar52 - sVar31;
    auVar69._4_2_ = sVar53 - sVar32;
    auVar69._6_2_ = sVar54 - sVar33;
    auVar69._8_2_ = sVar55 - sVar34;
    auVar69._10_2_ = sVar56 - sVar35;
    auVar69._12_2_ = sVar57 - sVar36;
    auVar69._14_2_ = sVar58 - uVar16;
    auVar59 = pabsw(auVar69,auVar69);
    auVar63._0_2_ = sVar48 - sVar26;
    auVar63._2_2_ = sVar52 - sVar29;
    auVar63._4_2_ = sVar53 - sVar26;
    auVar63._6_2_ = sVar54 - sVar29;
    auVar63._8_2_ = sVar55 - sVar26;
    auVar63._10_2_ = sVar56 - sVar29;
    auVar63._12_2_ = sVar57 - sVar26;
    auVar63._14_2_ = sVar58 - sVar29;
    auVar63 = pabsw(in_XMM13,auVar63);
    sVar66 = auVar27._0_2_;
    auVar67._0_2_ = -(ushort)(auVar59._0_2_ < sVar66);
    sVar74 = auVar27._2_2_;
    auVar67._2_2_ = -(ushort)(auVar59._2_2_ < sVar74);
    sVar75 = auVar27._4_2_;
    auVar67._4_2_ = -(ushort)(auVar59._4_2_ < sVar75);
    sVar76 = auVar27._6_2_;
    auVar67._6_2_ = -(ushort)(auVar59._6_2_ < sVar76);
    sVar77 = auVar27._8_2_;
    auVar67._8_2_ = -(ushort)(auVar59._8_2_ < sVar77);
    sVar78 = auVar27._10_2_;
    auVar67._10_2_ = -(ushort)(auVar59._10_2_ < sVar78);
    sVar79 = auVar27._12_2_;
    sVar80 = auVar27._14_2_;
    auVar67._12_2_ = -(ushort)(auVar59._12_2_ < sVar79);
    auVar67._14_2_ = -(ushort)(auVar59._14_2_ < sVar80);
    auVar49._0_2_ = -(ushort)(auVar63._0_2_ < sVar66);
    auVar49._2_2_ = -(ushort)(auVar63._2_2_ < sVar74);
    auVar49._4_2_ = -(ushort)(auVar63._4_2_ < sVar75);
    auVar49._6_2_ = -(ushort)(auVar63._6_2_ < sVar76);
    auVar49._8_2_ = -(ushort)(auVar63._8_2_ < sVar77);
    auVar49._10_2_ = -(ushort)(auVar63._10_2_ < sVar78);
    auVar49._12_2_ = -(ushort)(auVar63._12_2_ < sVar79);
    auVar49._14_2_ = -(ushort)(auVar63._14_2_ < sVar80);
    auVar60._0_2_ = -(ushort)(auVar63._0_2_ < auVar59._0_2_);
    auVar60._2_2_ = -(ushort)(auVar63._2_2_ < auVar59._2_2_);
    auVar60._4_2_ = -(ushort)(auVar63._4_2_ < auVar59._4_2_);
    auVar60._6_2_ = -(ushort)(auVar63._6_2_ < auVar59._6_2_);
    auVar60._8_2_ = -(ushort)(auVar63._8_2_ < auVar59._8_2_);
    auVar60._10_2_ = -(ushort)(auVar63._10_2_ < auVar59._10_2_);
    auVar60._12_2_ = -(ushort)(auVar63._12_2_ < auVar59._12_2_);
    auVar60._14_2_ = -(ushort)(auVar63._14_2_ < auVar59._14_2_);
    sVar48 = auVar37._0_2_ + auVar47._0_2_;
    sVar52 = auVar37._2_2_ + auVar47._2_2_;
    sVar53 = auVar37._4_2_ + auVar47._4_2_;
    sVar54 = auVar37._6_2_ + auVar47._6_2_;
    sVar55 = auVar37._8_2_ + auVar47._8_2_;
    sVar56 = auVar37._10_2_ + auVar47._10_2_;
    sVar57 = auVar37._12_2_ + auVar47._12_2_;
    sVar58 = auVar37._14_2_ + auVar47._14_2_;
    auVar68._0_2_ = sVar48 - auVar24._0_2_;
    auVar68._2_2_ = sVar52 - uVar38;
    auVar68._4_2_ = sVar53 - uVar39;
    auVar68._6_2_ = sVar54 - uVar40;
    auVar68._8_2_ = sVar55 - uVar41;
    auVar68._10_2_ = sVar56 - uVar42;
    auVar68._12_2_ = sVar57 - uVar43;
    auVar68._14_2_ = sVar58 - uVar44;
    auVar69 = pabsw(auVar68,auVar68);
    auVar64._0_2_ = sVar48 - sVar26;
    auVar64._2_2_ = sVar52 - sVar29;
    auVar64._4_2_ = sVar53 - sVar26;
    auVar64._6_2_ = sVar54 - sVar29;
    auVar64._8_2_ = sVar55 - sVar26;
    auVar64._10_2_ = sVar56 - sVar29;
    auVar64._12_2_ = sVar57 - sVar26;
    auVar64._14_2_ = sVar58 - sVar29;
    auVar63 = pabsw(auVar64,auVar64);
    sVar81 = auVar45._0_2_;
    auVar82._0_2_ = -(ushort)(auVar69._0_2_ < sVar81);
    sVar84 = auVar45._2_2_;
    auVar82._2_2_ = -(ushort)(auVar69._2_2_ < sVar84);
    sVar85 = auVar45._4_2_;
    auVar82._4_2_ = -(ushort)(auVar69._4_2_ < sVar85);
    sVar86 = auVar45._6_2_;
    auVar82._6_2_ = -(ushort)(auVar69._6_2_ < sVar86);
    sVar87 = auVar45._8_2_;
    auVar82._8_2_ = -(ushort)(auVar69._8_2_ < sVar87);
    sVar88 = auVar45._10_2_;
    auVar82._10_2_ = -(ushort)(auVar69._10_2_ < sVar88);
    sVar89 = auVar45._12_2_;
    sVar90 = auVar45._14_2_;
    auVar82._12_2_ = -(ushort)(auVar69._12_2_ < sVar89);
    auVar82._14_2_ = -(ushort)(auVar69._14_2_ < sVar90);
    auVar59._0_2_ = -(ushort)(auVar63._0_2_ < sVar81);
    auVar59._2_2_ = -(ushort)(auVar63._2_2_ < sVar84);
    auVar59._4_2_ = -(ushort)(auVar63._4_2_ < sVar85);
    auVar59._6_2_ = -(ushort)(auVar63._6_2_ < sVar86);
    auVar59._8_2_ = -(ushort)(auVar63._8_2_ < sVar87);
    auVar59._10_2_ = -(ushort)(auVar63._10_2_ < sVar88);
    auVar59._12_2_ = -(ushort)(auVar63._12_2_ < sVar89);
    auVar59._14_2_ = -(ushort)(auVar63._14_2_ < sVar90);
    auVar70._0_2_ = -(ushort)(auVar63._0_2_ < auVar69._0_2_);
    auVar70._2_2_ = -(ushort)(auVar63._2_2_ < auVar69._2_2_);
    auVar70._4_2_ = -(ushort)(auVar63._4_2_ < auVar69._4_2_);
    auVar70._6_2_ = -(ushort)(auVar63._6_2_ < auVar69._6_2_);
    auVar70._8_2_ = -(ushort)(auVar63._8_2_ < auVar69._8_2_);
    auVar70._10_2_ = -(ushort)(auVar63._10_2_ < auVar69._10_2_);
    auVar70._12_2_ = -(ushort)(auVar63._12_2_ < auVar69._12_2_);
    auVar70._14_2_ = -(ushort)(auVar63._14_2_ < auVar69._14_2_);
    in_XMM13 = auVar28 & auVar70;
    auVar63 = ~(auVar49 | auVar67) & auVar47 |
              (~auVar60 & auVar25 | auVar28 & auVar60) & (auVar49 | auVar67);
    auVar59 = ~(auVar59 | auVar82) & auVar47 | (~auVar70 & auVar24 | in_XMM13) & (auVar59 | auVar82)
    ;
    sVar48 = auVar63._0_2_;
    sVar52 = auVar63._2_2_;
    sVar53 = auVar63._4_2_;
    sVar54 = auVar63._6_2_;
    sVar55 = auVar63._8_2_;
    sVar56 = auVar63._10_2_;
    sVar57 = auVar63._12_2_;
    sVar58 = auVar63._14_2_;
    sVar2 = auVar59._0_2_;
    sVar3 = auVar59._2_2_;
    sVar4 = auVar59._4_2_;
    sVar5 = auVar59._6_2_;
    sVar6 = auVar59._8_2_;
    sVar7 = auVar59._10_2_;
    sVar8 = auVar59._12_2_;
    sVar9 = auVar59._14_2_;
    *dst = (0 < sVar48) * (sVar48 < 0x100) * auVar63[0] - (0xff < sVar48);
    dst[1] = (0 < sVar52) * (sVar52 < 0x100) * auVar63[2] - (0xff < sVar52);
    dst[2] = (0 < sVar53) * (sVar53 < 0x100) * auVar63[4] - (0xff < sVar53);
    dst[3] = (0 < sVar54) * (sVar54 < 0x100) * auVar63[6] - (0xff < sVar54);
    dst[4] = (0 < sVar55) * (sVar55 < 0x100) * auVar63[8] - (0xff < sVar55);
    dst[5] = (0 < sVar56) * (sVar56 < 0x100) * auVar63[10] - (0xff < sVar56);
    dst[6] = (0 < sVar57) * (sVar57 < 0x100) * auVar63[0xc] - (0xff < sVar57);
    dst[7] = (0 < sVar58) * (sVar58 < 0x100) * auVar63[0xe] - (0xff < sVar58);
    dst[8] = (0 < sVar2) * (sVar2 < 0x100) * auVar59[0] - (0xff < sVar2);
    dst[9] = (0 < sVar3) * (sVar3 < 0x100) * auVar59[2] - (0xff < sVar3);
    dst[10] = (0 < sVar4) * (sVar4 < 0x100) * auVar59[4] - (0xff < sVar4);
    dst[0xb] = (0 < sVar5) * (sVar5 < 0x100) * auVar59[6] - (0xff < sVar5);
    dst[0xc] = (0 < sVar6) * (sVar6 < 0x100) * auVar59[8] - (0xff < sVar6);
    dst[0xd] = (0 < sVar7) * (sVar7 < 0x100) * auVar59[10] - (0xff < sVar7);
    dst[0xe] = (0 < sVar8) * (sVar8 < 0x100) * auVar59[0xc] - (0xff < sVar8);
    dst[0xf] = (0 < sVar9) * (sVar9 < 0x100) * auVar59[0xe] - (0xff < sVar9);
    dst = dst + stride;
    auVar47._0_2_ = auVar46._0_2_ + 1;
    auVar47._2_2_ = auVar46._2_2_ + 1;
    auVar47._4_2_ = auVar46._4_2_ + 1;
    auVar47._6_2_ = auVar46._6_2_ + 1;
    auVar47._8_2_ = auVar46._8_2_ + 1;
    auVar47._10_2_ = auVar46._10_2_ + 1;
    auVar47._12_2_ = auVar46._12_2_ + 1;
    auVar47._14_2_ = auVar46._14_2_ + 1;
    iVar23 = iVar23 + -1;
    auVar46 = auVar47;
  } while (iVar23 != 0);
  auVar1 = *(undefined1 (*) [16])(left + 0x10);
  iVar23 = 0x10;
  auVar46 = _DAT_004d8ba0;
  do {
    auVar27 = pshufb(auVar1,auVar46);
    sVar48 = auVar30._0_2_ + auVar27._0_2_;
    sVar52 = auVar30._2_2_ + auVar27._2_2_;
    sVar53 = auVar30._4_2_ + auVar27._4_2_;
    sVar54 = auVar30._6_2_ + auVar27._6_2_;
    sVar55 = auVar30._8_2_ + auVar27._8_2_;
    sVar56 = auVar30._10_2_ + auVar27._10_2_;
    sVar57 = auVar30._12_2_ + auVar27._12_2_;
    sVar58 = auVar30._14_2_ + auVar27._14_2_;
    auVar61._0_2_ = sVar48 - auVar25._0_2_;
    auVar61._2_2_ = sVar52 - sVar31;
    auVar61._4_2_ = sVar53 - sVar32;
    auVar61._6_2_ = sVar54 - sVar33;
    auVar61._8_2_ = sVar55 - sVar34;
    auVar61._10_2_ = sVar56 - sVar35;
    auVar61._12_2_ = sVar57 - sVar36;
    auVar61._14_2_ = sVar58 - uVar16;
    auVar45 = pabsw(auVar61,auVar61);
    auVar50._0_2_ = sVar48 - sVar26;
    auVar50._2_2_ = sVar52 - sVar29;
    auVar50._4_2_ = sVar53 - sVar26;
    auVar50._6_2_ = sVar54 - sVar29;
    auVar50._8_2_ = sVar55 - sVar26;
    auVar50._10_2_ = sVar56 - sVar29;
    auVar50._12_2_ = sVar57 - sVar26;
    auVar50._14_2_ = sVar58 - sVar29;
    auVar59 = pabsw(in_XMM13,auVar50);
    auVar71._0_2_ = -(ushort)(auVar45._0_2_ < sVar66);
    auVar71._2_2_ = -(ushort)(auVar45._2_2_ < sVar74);
    auVar71._4_2_ = -(ushort)(auVar45._4_2_ < sVar75);
    auVar71._6_2_ = -(ushort)(auVar45._6_2_ < sVar76);
    auVar71._8_2_ = -(ushort)(auVar45._8_2_ < sVar77);
    auVar71._10_2_ = -(ushort)(auVar45._10_2_ < sVar78);
    auVar71._12_2_ = -(ushort)(auVar45._12_2_ < sVar79);
    auVar71._14_2_ = -(ushort)(auVar45._14_2_ < sVar80);
    auVar51._0_2_ = -(ushort)(auVar59._0_2_ < sVar66);
    auVar51._2_2_ = -(ushort)(auVar59._2_2_ < sVar74);
    auVar51._4_2_ = -(ushort)(auVar59._4_2_ < sVar75);
    auVar51._6_2_ = -(ushort)(auVar59._6_2_ < sVar76);
    auVar51._8_2_ = -(ushort)(auVar59._8_2_ < sVar77);
    auVar51._10_2_ = -(ushort)(auVar59._10_2_ < sVar78);
    auVar51._12_2_ = -(ushort)(auVar59._12_2_ < sVar79);
    auVar51._14_2_ = -(ushort)(auVar59._14_2_ < sVar80);
    auVar62._0_2_ = -(ushort)(auVar59._0_2_ < auVar45._0_2_);
    auVar62._2_2_ = -(ushort)(auVar59._2_2_ < auVar45._2_2_);
    auVar62._4_2_ = -(ushort)(auVar59._4_2_ < auVar45._4_2_);
    auVar62._6_2_ = -(ushort)(auVar59._6_2_ < auVar45._6_2_);
    auVar62._8_2_ = -(ushort)(auVar59._8_2_ < auVar45._8_2_);
    auVar62._10_2_ = -(ushort)(auVar59._10_2_ < auVar45._10_2_);
    auVar62._12_2_ = -(ushort)(auVar59._12_2_ < auVar45._12_2_);
    auVar62._14_2_ = -(ushort)(auVar59._14_2_ < auVar45._14_2_);
    sVar48 = auVar37._0_2_ + auVar27._0_2_;
    sVar52 = auVar37._2_2_ + auVar27._2_2_;
    sVar53 = auVar37._4_2_ + auVar27._4_2_;
    sVar54 = auVar37._6_2_ + auVar27._6_2_;
    sVar55 = auVar37._8_2_ + auVar27._8_2_;
    sVar56 = auVar37._10_2_ + auVar27._10_2_;
    sVar57 = auVar37._12_2_ + auVar27._12_2_;
    sVar58 = auVar37._14_2_ + auVar27._14_2_;
    auVar72._0_2_ = sVar48 - auVar24._0_2_;
    auVar72._2_2_ = sVar52 - uVar38;
    auVar72._4_2_ = sVar53 - uVar39;
    auVar72._6_2_ = sVar54 - uVar40;
    auVar72._8_2_ = sVar55 - uVar41;
    auVar72._10_2_ = sVar56 - uVar42;
    auVar72._12_2_ = sVar57 - uVar43;
    auVar72._14_2_ = sVar58 - uVar44;
    auVar47 = pabsw(auVar72,auVar72);
    auVar65._0_2_ = sVar48 - sVar26;
    auVar65._2_2_ = sVar52 - sVar29;
    auVar65._4_2_ = sVar53 - sVar26;
    auVar65._6_2_ = sVar54 - sVar29;
    auVar65._8_2_ = sVar55 - sVar26;
    auVar65._10_2_ = sVar56 - sVar29;
    auVar65._12_2_ = sVar57 - sVar26;
    auVar65._14_2_ = sVar58 - sVar29;
    auVar59 = pabsw(auVar65,auVar65);
    auVar83._0_2_ = -(ushort)(auVar47._0_2_ < sVar81);
    auVar83._2_2_ = -(ushort)(auVar47._2_2_ < sVar84);
    auVar83._4_2_ = -(ushort)(auVar47._4_2_ < sVar85);
    auVar83._6_2_ = -(ushort)(auVar47._6_2_ < sVar86);
    auVar83._8_2_ = -(ushort)(auVar47._8_2_ < sVar87);
    auVar83._10_2_ = -(ushort)(auVar47._10_2_ < sVar88);
    auVar83._12_2_ = -(ushort)(auVar47._12_2_ < sVar89);
    auVar83._14_2_ = -(ushort)(auVar47._14_2_ < sVar90);
    auVar45._0_2_ = -(ushort)(auVar59._0_2_ < sVar81);
    auVar45._2_2_ = -(ushort)(auVar59._2_2_ < sVar84);
    auVar45._4_2_ = -(ushort)(auVar59._4_2_ < sVar85);
    auVar45._6_2_ = -(ushort)(auVar59._6_2_ < sVar86);
    auVar45._8_2_ = -(ushort)(auVar59._8_2_ < sVar87);
    auVar45._10_2_ = -(ushort)(auVar59._10_2_ < sVar88);
    auVar45._12_2_ = -(ushort)(auVar59._12_2_ < sVar89);
    auVar45._14_2_ = -(ushort)(auVar59._14_2_ < sVar90);
    auVar73._0_2_ = -(ushort)(auVar59._0_2_ < auVar47._0_2_);
    auVar73._2_2_ = -(ushort)(auVar59._2_2_ < auVar47._2_2_);
    auVar73._4_2_ = -(ushort)(auVar59._4_2_ < auVar47._4_2_);
    auVar73._6_2_ = -(ushort)(auVar59._6_2_ < auVar47._6_2_);
    auVar73._8_2_ = -(ushort)(auVar59._8_2_ < auVar47._8_2_);
    auVar73._10_2_ = -(ushort)(auVar59._10_2_ < auVar47._10_2_);
    auVar73._12_2_ = -(ushort)(auVar59._12_2_ < auVar47._12_2_);
    auVar73._14_2_ = -(ushort)(auVar59._14_2_ < auVar47._14_2_);
    in_XMM13 = auVar28 & auVar73;
    auVar59 = ~(auVar51 | auVar71) & auVar27 |
              (~auVar62 & auVar25 | auVar28 & auVar62) & (auVar51 | auVar71);
    auVar27 = ~(auVar45 | auVar83) & auVar27 | (~auVar73 & auVar24 | in_XMM13) & (auVar45 | auVar83)
    ;
    sVar48 = auVar59._0_2_;
    sVar52 = auVar59._2_2_;
    sVar53 = auVar59._4_2_;
    sVar54 = auVar59._6_2_;
    sVar55 = auVar59._8_2_;
    sVar56 = auVar59._10_2_;
    sVar57 = auVar59._12_2_;
    sVar58 = auVar59._14_2_;
    sVar2 = auVar27._0_2_;
    sVar3 = auVar27._2_2_;
    sVar4 = auVar27._4_2_;
    sVar5 = auVar27._6_2_;
    sVar6 = auVar27._8_2_;
    sVar7 = auVar27._10_2_;
    sVar8 = auVar27._12_2_;
    sVar9 = auVar27._14_2_;
    *dst = (0 < sVar48) * (sVar48 < 0x100) * auVar59[0] - (0xff < sVar48);
    dst[1] = (0 < sVar52) * (sVar52 < 0x100) * auVar59[2] - (0xff < sVar52);
    dst[2] = (0 < sVar53) * (sVar53 < 0x100) * auVar59[4] - (0xff < sVar53);
    dst[3] = (0 < sVar54) * (sVar54 < 0x100) * auVar59[6] - (0xff < sVar54);
    dst[4] = (0 < sVar55) * (sVar55 < 0x100) * auVar59[8] - (0xff < sVar55);
    dst[5] = (0 < sVar56) * (sVar56 < 0x100) * auVar59[10] - (0xff < sVar56);
    dst[6] = (0 < sVar57) * (sVar57 < 0x100) * auVar59[0xc] - (0xff < sVar57);
    dst[7] = (0 < sVar58) * (sVar58 < 0x100) * auVar59[0xe] - (0xff < sVar58);
    dst[8] = (0 < sVar2) * (sVar2 < 0x100) * auVar27[0] - (0xff < sVar2);
    dst[9] = (0 < sVar3) * (sVar3 < 0x100) * auVar27[2] - (0xff < sVar3);
    dst[10] = (0 < sVar4) * (sVar4 < 0x100) * auVar27[4] - (0xff < sVar4);
    dst[0xb] = (0 < sVar5) * (sVar5 < 0x100) * auVar27[6] - (0xff < sVar5);
    dst[0xc] = (0 < sVar6) * (sVar6 < 0x100) * auVar27[8] - (0xff < sVar6);
    dst[0xd] = (0 < sVar7) * (sVar7 < 0x100) * auVar27[10] - (0xff < sVar7);
    dst[0xe] = (0 < sVar8) * (sVar8 < 0x100) * auVar27[0xc] - (0xff < sVar8);
    dst[0xf] = (0 < sVar9) * (sVar9 < 0x100) * auVar27[0xe] - (0xff < sVar9);
    dst = dst + stride;
    auVar27._0_2_ = auVar46._0_2_ + 1;
    auVar27._2_2_ = auVar46._2_2_ + 1;
    auVar27._4_2_ = auVar46._4_2_ + 1;
    auVar27._6_2_ = auVar46._6_2_ + 1;
    auVar27._8_2_ = auVar46._8_2_ + 1;
    auVar27._10_2_ = auVar46._10_2_ + 1;
    auVar27._12_2_ = auVar46._12_2_ + 1;
    auVar27._14_2_ = auVar46._14_2_ + 1;
    iVar23 = iVar23 + -1;
    auVar46 = auVar27;
  } while (iVar23 != 0);
  return;
}

Assistant:

void aom_paeth_predictor_16x32_ssse3(uint8_t *dst, ptrdiff_t stride,
                                     const uint8_t *above,
                                     const uint8_t *left) {
  __m128i l = _mm_load_si128((const __m128i *)left);
  const __m128i t = _mm_load_si128((const __m128i *)above);
  const __m128i zero = _mm_setzero_si128();
  const __m128i top0 = _mm_unpacklo_epi8(t, zero);
  const __m128i top1 = _mm_unpackhi_epi8(t, zero);
  const __m128i tl16 = _mm_set1_epi16((int16_t)above[-1]);
  __m128i rep = _mm_set1_epi16((short)0x8000);
  const __m128i one = _mm_set1_epi16(1);
  __m128i l16;

  int i;
  for (i = 0; i < 16; ++i) {
    l16 = _mm_shuffle_epi8(l, rep);
    const __m128i row = paeth_16x1_pred(&l16, &top0, &top1, &tl16);

    _mm_store_si128((__m128i *)dst, row);
    dst += stride;
    rep = _mm_add_epi16(rep, one);
  }

  l = _mm_load_si128((const __m128i *)(left + 16));
  rep = _mm_set1_epi16((short)0x8000);
  for (i = 0; i < 16; ++i) {
    l16 = _mm_shuffle_epi8(l, rep);
    const __m128i row = paeth_16x1_pred(&l16, &top0, &top1, &tl16);

    _mm_store_si128((__m128i *)dst, row);
    dst += stride;
    rep = _mm_add_epi16(rep, one);
  }
}